

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

Entry * __thiscall
kj::Vector<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Entry>::
add<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Entry>
          (Vector<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Entry> *this,Entry *params)

{
  bool bVar1;
  Entry *pEVar2;
  Entry *params_local;
  Vector<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Entry> *this_local;
  
  bVar1 = ArrayBuilder<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Entry>::isFull
                    ((ArrayBuilder<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Entry> *)this)
  ;
  if (bVar1) {
    Vector<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Entry>::grow
              ((Vector<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Entry> *)this,0);
  }
  pEVar2 = fwd<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Entry>(params);
  pEVar2 = ArrayBuilder<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Entry>::
           add<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Entry>
                     ((ArrayBuilder<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Entry> *)this,
                      pEVar2);
  return pEVar2;
}

Assistant:

inline T& add(Params&&... params) KJ_LIFETIMEBOUND {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }